

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O2

double __thiscall Measurement::NIS(Measurement *this,VectorXd *z_pred,MatrixXd *S)

{
  double dVar1;
  VectorXd z_diff;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3>
  local_70;
  Matrix<double,__1,_1,_0,__1,_1> local_68;
  MatrixTypeNested local_58;
  ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_50;
  
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_50,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->measurements_,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z_pred);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_68,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_50);
  local_78.m_matrix = (Nested)&local_68;
  local_58 = (MatrixTypeNested)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)S);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::ProductBase(&local_50,&local_78,
                (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_58);
  Eigen::
  GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>
  ::GeneralProduct(&local_70,
                   (GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>
                    *)&local_50,&local_68);
  this->nis_ = (double)local_70.super_Matrix<double,_1,_1,_0,_1,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
                       .array[0];
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~ProductBase(&local_50);
  dVar1 = this->nis_;
  free(local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return dVar1;
}

Assistant:

double Measurement::NIS(const VectorXd &z_pred, const MatrixXd &S) {

  // TODO check dimensions
  VectorXd z_diff = measurements_ - z_pred;
  nis_ = z_diff.transpose() * S.inverse() * z_diff;
  return nis_;
}